

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.cpp
# Opt level: O2

int main(int raw_argc,char **raw_argv)

{
  uint uVar1;
  bool bVar2;
  FILE *pFVar3;
  pointer pcVar4;
  llama_context *plVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  bool bVar9;
  byte bVar10;
  bool bVar11;
  char cVar12;
  bool bVar13;
  byte bVar14;
  byte bVar15;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  pointer pcVar16;
  llama_vocab *vocab;
  int *piVar17;
  undefined8 uVar18;
  long lVar19;
  int i;
  int iVar20;
  ulong uVar21;
  llama_model_params *plVar22;
  llama_context_params *plVar23;
  char *pcVar24;
  undefined8 *puVar25;
  int iVar26;
  ulong uVar27;
  size_t sStack_560;
  undefined8 auStack_558 [16];
  char *local_4d8;
  ulong local_4d0;
  pointer local_4c8;
  llama_context *local_4c0;
  ulong local_4b8;
  ulong local_4b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argv;
  vector<int,_std::allocator<int>_> tokens;
  pointer local_430;
  string prompt;
  llama_model_params model_params;
  string arg;
  uint auStack_3a0 [122];
  llama_context_params ctx_params;
  
  bVar15 = 0;
  argv.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  argv.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  argv.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar27 = 0;
  local_4c0 = (llama_context *)CONCAT44(local_4c0._4_4_,raw_argc);
  uVar21 = 0;
  if (0 < raw_argc) {
    uVar21 = (ulong)(uint)raw_argc;
  }
  for (; uVar21 != uVar27; uVar27 = uVar27 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg,raw_argv[uVar27],(allocator<char> *)&ctx_params);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&argv,&arg);
    std::__cxx11::string::~string((string *)&arg);
  }
  if ((long)argv.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)argv.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5 != ((ulong)local_4c0 & 0xffffffff)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/tokenize/tokenize.cpp"
               ,0x74,"GGML_ASSERT(%s) failed","(unsigned int) argc == argv.size()");
LAB_0011f923:
    pcVar24 = "model_path";
    uVar18 = 0x133;
LAB_0011f93d:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/tokenize/tokenize.cpp"
               ,uVar18,"GGML_ASSERT(%s) failed",pcVar24);
LAB_0011f952:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/tokenize/tokenize.cpp"
               ,0x166,"GGML_ASSERT(%s) failed","!prompt_path_set && !prompt_set");
LAB_0011f973:
    uVar18 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/tokenize/tokenize.cpp"
                        ,0x144,"GGML_ASSERT(%s) failed","stdin_set");
    std::__cxx11::string::~string((string *)&prompt);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&argv);
    _Unwind_Resume(uVar18);
  }
  if ((int)local_4c0 < 2) {
    print_usage_information
              (((argv.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
LAB_0011ee4a:
    iVar20 = 1;
  }
  else {
    iVar26 = 1;
    bVar13 = false;
    local_4b8 = 0;
    local_4c8 = (pointer)0x0;
    local_4d8 = (char *)0x0;
    local_430 = (pointer)0x0;
    bVar2 = false;
    local_4d0 = 0;
    bVar11 = false;
    cVar12 = '\0';
    bVar10 = 0;
    bVar9 = false;
    bVar8 = 0;
    local_4b0 = 0;
    iVar20 = 0;
    do {
      uVar27 = local_4b8;
      pcVar4 = local_4c8;
      uVar21 = local_4d0;
      if ((int)local_4c0 <= iVar26) {
        if ((bVar2) && (local_4c8 == (pointer)0x0)) {
          pcVar24 = "Error: --model requires an argument.\n";
          sStack_560 = 0x25;
LAB_0011f7c0:
          fwrite(pcVar24,sStack_560,1,_stderr);
          goto LAB_0011ee4a;
        }
        if (!bVar2) {
          pcVar24 = "Error: must specify --model.\n";
          sStack_560 = 0x1d;
          goto LAB_0011f7c0;
        }
        if (((local_4d0 & 1) != 0) && (local_4d8 == (char *)0x0)) {
          pcVar24 = "Error: --file requires an argument.\n";
          sStack_560 = 0x24;
          goto LAB_0011f7c0;
        }
        if ((bVar11) && (local_430 == (pointer)0x0)) {
          pcVar24 = "Error: --prompt requires an argument.\n";
          sStack_560 = 0x26;
          goto LAB_0011f7c0;
        }
        bVar14 = cVar12 + bVar11 + ((byte)local_4d0 & 1);
        if (1 < bVar14) {
          pcVar24 = "Error: --stdin, --file and --prompt are mutually exclusive.\n";
          sStack_560 = 0x3c;
          goto LAB_0011f7c0;
        }
        if (bVar14 == 0) {
          pcVar24 = "Error: must specify one of: --stdin, --file or --prompt.\n";
          sStack_560 = 0x39;
          goto LAB_0011f7c0;
        }
        if (local_4c8 == (pointer)0x0) goto LAB_0011f923;
        if ((local_4d8 == (char *)0x0 && local_430 == (pointer)0x0) && cVar12 == '\0') {
          pcVar24 = "prompt_path || prompt_arg || stdin_set";
          uVar18 = 0x134;
          goto LAB_0011f93d;
        }
        prompt._M_dataplus._M_p = (pointer)&prompt.field_2;
        prompt._M_string_length = 0;
        prompt.field_2._M_local_buf[0] = '\0';
        if ((local_4d0 & 1) == 0) {
          if (bVar11) {
            std::__cxx11::string::assign((char *)&prompt);
          }
          else if (cVar12 == '\0') goto LAB_0011f973;
        }
        else {
          std::ifstream::ifstream(&arg,local_4d8,_S_bin);
          pFVar3 = _stderr;
          if ((*(byte *)((long)auStack_3a0 + *(long *)(arg._M_dataplus._M_p + -0x18)) & 5) != 0) {
            piVar17 = __errno_location();
            pcVar24 = strerror(*piVar17);
            fprintf(pFVar3,"%s: could not open file \'%s\' for reading: %s\n",
                    "read_prompt_from_file",local_4d8,pcVar24);
            model_params.devices = (ggml_backend_dev_t *)&model_params.n_gpu_layers;
            model_params.tensor_buft_overrides = (llama_model_tensor_buft_override *)0x0;
            model_params.n_gpu_layers._0_1_ = 0;
            std::ifstream::~ifstream(&arg);
            std::__cxx11::string::operator=((string *)&prompt,(string *)&model_params);
            std::__cxx11::string::~string((string *)&model_params);
            goto LAB_0011f3ae;
          }
          std::__cxx11::stringstream::stringstream((stringstream *)&ctx_params);
          std::ostream::operator<<
                    ((ostream *)&ctx_params.n_threads,(streambuf *)arg.field_2._M_local_buf);
          pFVar3 = _stderr;
          uVar1 = *(uint *)((long)auStack_3a0 + *(long *)(arg._M_dataplus._M_p + -0x18));
          if ((uVar1 & 5) == 0) {
            std::__cxx11::stringbuf::str();
          }
          else {
            piVar17 = __errno_location();
            pcVar24 = strerror(*piVar17);
            fprintf(pFVar3,"%s: could not read the entire file \'%s\': %s\n","read_prompt_from_file"
                    ,local_4d8,pcVar24);
            model_params.devices = (ggml_backend_dev_t *)&model_params.n_gpu_layers;
            model_params.tensor_buft_overrides = (llama_model_tensor_buft_override *)0x0;
            model_params.n_gpu_layers._0_1_ = 0;
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ctx_params);
          std::ifstream::~ifstream(&arg);
          std::__cxx11::string::operator=((string *)&prompt,(string *)&model_params);
          std::__cxx11::string::~string((string *)&model_params);
          uVar21 = local_4d0;
          if ((uVar1 & 5) != 0) goto LAB_0011f3ae;
        }
        if (bVar13) {
          llama_log_set(llama_log_callback_null,0);
        }
        llama_backend_init();
        llama_model_default_params(&model_params);
        model_params.vocab_only = true;
        plVar22 = &model_params;
        puVar25 = auStack_558;
        for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
          *puVar25 = plVar22->devices;
          plVar22 = (llama_model_params *)((long)plVar22 + (ulong)bVar15 * -0x10 + 8);
          puVar25 = puVar25 + (ulong)bVar15 * -2 + 1;
        }
        pcVar16 = (pointer)llama_model_load_from_file(pcVar4);
        if (pcVar16 != (pointer)0x0) {
          local_4c8 = pcVar16;
          vocab = (llama_vocab *)llama_model_get_vocab(pcVar16);
          llama_context_default_params(&ctx_params);
          plVar23 = &ctx_params;
          puVar25 = auStack_558;
          for (lVar19 = 0xf; lVar19 != 0; lVar19 = lVar19 + -1) {
            *puVar25 = *(undefined8 *)plVar23;
            plVar23 = (llama_context_params *)((long)plVar23 + (ulong)bVar15 * -0x10 + 8);
            puVar25 = puVar25 + (ulong)bVar15 * -2 + 1;
          }
          local_4c0 = (llama_context *)llama_init_from_model(local_4c8);
          if (local_4c0 == (llama_context *)0x0) {
            fwrite("Error: could not create context.\n",0x21,1,_stderr);
            goto LAB_0011f3ae;
          }
          if (cVar12 == '\0') {
LAB_0011f52a:
            bVar15 = llama_vocab_get_add_bos(vocab);
            if (!bVar9) {
              string_process_escapes(&prompt);
            }
            tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            common_tokenize((vector<int,_std::allocator<int>_> *)&arg,vocab,&prompt,
                            (bool)(bVar15 & (bVar8 ^ 1)),(bool)(bVar10 ^ 1));
            local_4b8 = uVar27;
            std::vector<int,_std::allocator<int>_>::_M_move_assign(&tokens,&arg);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&arg);
            if ((local_4b0 & 1) != 0) {
              putchar(0x5b);
            }
            for (lVar19 = 0;
                lVar19 < (int)((ulong)((long)tokens.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      (long)tokens.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start) >> 2);
                lVar19 = lVar19 + 1) {
              if ((local_4b0 & 1) == 0) {
                printf("%6d -> \'",
                       (ulong)(uint)tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar19]);
                common_token_to_piece_abi_cxx11_
                          (&arg,local_4c0,
                           tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar19],true);
                printf("%s",arg._M_dataplus._M_p);
                std::__cxx11::string::~string((string *)&arg);
                puts("\'");
              }
              else {
                if (lVar19 != 0) {
                  printf(", ");
                }
                printf("%d",(ulong)(uint)tokens.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start[lVar19]);
              }
            }
            if ((local_4b0 & 1) != 0) {
              puts("]");
            }
            plVar5 = local_4c0;
            pcVar4 = local_4c8;
            if ((local_4b8 & 1) != 0) {
              printf("Total number of tokens: %zu\n",
                     (long)tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2);
            }
            llama_free(plVar5);
            llama_model_free(pcVar4);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&tokens.super__Vector_base<int,_std::allocator<int>_>);
            iVar20 = 0;
            goto LAB_0011f716;
          }
          if (((uVar21 & 1) == 0) && (!bVar11)) {
            std::__cxx11::stringstream::stringstream((stringstream *)&arg);
            std::ostream::operator<<
                      ((ostream *)arg.field_2._M_local_buf,
                       *(streambuf **)(std::terminate + *(long *)(std::cin + -0x18)));
            uVar1 = *(uint *)(llama_n_ctx + *(long *)(std::cin + -0x18));
            if ((uVar1 & 5) == 0) {
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::operator=((string *)&prompt,(string *)&tokens);
              std::__cxx11::string::~string((string *)&tokens);
            }
            else {
              fwrite("Error: could not read the entire standard input.\n",0x31,1,_stderr);
              iVar20 = 1;
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)&arg);
            if ((uVar1 & 5) == 0) goto LAB_0011f52a;
            goto LAB_0011f716;
          }
          goto LAB_0011f952;
        }
        fprintf(_stderr,"Error: could not load model from file \'%s\'.\n",pcVar4);
LAB_0011f3ae:
        iVar20 = 1;
LAB_0011f716:
        std::__cxx11::string::~string((string *)&prompt);
        break;
      }
      std::__cxx11::string::string
                ((string *)&arg,
                 (string *)
                 (argv.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar26));
      bVar6 = std::operator==(&arg,"-h");
      if ((bVar6) || (bVar6 = std::operator==(&arg,"--help"), bVar6)) {
        print_usage_information
                  (((argv.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
        bVar6 = false;
        iVar20 = 0;
      }
      else {
        bVar7 = std::operator==(&arg,"--ids");
        bVar6 = true;
        if (bVar7) {
          local_4b0 = CONCAT71(extraout_var,1);
        }
        else {
          bVar6 = std::operator==(&arg,"-m");
          if ((bVar6) || (bVar6 = std::operator==(&arg,"--model"), bVar6)) {
            if (bVar2) {
              pcVar24 = "Error: -m or --model specified multiple times.\n";
              sStack_560 = 0x2f;
              goto LAB_0011f068;
            }
            local_4c8 = argv.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)iVar26 + 1]._M_dataplus._M_p
            ;
            bVar2 = true;
            goto LAB_0011efde;
          }
          bVar7 = std::operator==(&arg,"--no-bos");
          bVar6 = true;
          if (bVar7) {
            bVar8 = 1;
          }
          else {
            bVar7 = std::operator==(&arg,"--no-escape");
            bVar6 = true;
            if (bVar7) {
              bVar9 = true;
            }
            else {
              bVar7 = std::operator==(&arg,"--no-parse-special");
              bVar6 = true;
              if (bVar7) {
                bVar10 = 1;
              }
              else {
                bVar6 = std::operator==(&arg,"-p");
                if ((bVar6) || (bVar6 = std::operator==(&arg,"--prompt"), bVar6)) {
                  if (bVar11) {
                    pcVar24 = "Error: -p or --prompt specified multiple times.\n";
                    sStack_560 = 0x30;
LAB_0011f068:
                    fwrite(pcVar24,sStack_560,1,_stderr);
LAB_0011f074:
                    bVar6 = false;
                    iVar20 = 1;
                  }
                  else {
                    local_430 = argv.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(long)iVar26 + 1].
                                _M_dataplus._M_p;
                    bVar11 = true;
LAB_0011efde:
                    iVar26 = iVar26 + 1;
                    bVar6 = true;
                  }
                }
                else {
                  bVar6 = std::operator==(&arg,"-f");
                  if ((bVar6) || (bVar6 = std::operator==(&arg,"--file"), bVar6)) {
                    if ((local_4d0 & 1) != 0) {
                      pcVar24 = "Error: -f or --file specified multiple times.\n";
                      sStack_560 = 0x2e;
                      goto LAB_0011f068;
                    }
                    local_4d8 = argv.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(long)iVar26 + 1].
                                _M_dataplus._M_p;
                    local_4d0 = CONCAT71((int7)((ulong)local_4d8 >> 8),1);
                    goto LAB_0011efde;
                  }
                  bVar7 = std::operator==(&arg,"--stdin");
                  bVar6 = true;
                  if (bVar7) {
                    cVar12 = '\x01';
                  }
                  else {
                    bVar7 = std::operator==(&arg,"--log-disable");
                    bVar6 = true;
                    if (bVar7) {
                      bVar13 = true;
                    }
                    else {
                      bVar7 = std::operator==(&arg,"--show-count");
                      bVar6 = true;
                      if (!bVar7) {
                        fprintf(_stderr,"Error: unknown option \'%s\'\n",
                                argv.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar26]._M_dataplus._M_p);
                        goto LAB_0011f074;
                      }
                      local_4b8 = CONCAT71(extraout_var_00,1);
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&arg);
      iVar26 = iVar26 + 1;
    } while (bVar6);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&argv);
  return iVar20;
}

Assistant:

int main(int raw_argc, char ** raw_argv) {
    const std::vector<std::string> argv = ingest_args(raw_argc, raw_argv);
    const int argc = argv.size();

    if (argc <= 1) {
        print_usage_information(argv[0].c_str());
        return 1;
    }

    //////
    // Read out all the command line arguments.
    //////

    // variables where to put any arguments we see.
    bool printing_ids = false;
    bool no_bos = false;
    bool no_escape = false;
    bool no_parse_special = false;
    bool disable_logging = false;
    bool show_token_count = false;
    const char * model_path = NULL;
    const char * prompt_path = NULL;
    const char * prompt_arg = NULL;

    // track which arguments were explicitly given
    // used for sanity checking down the line
    bool model_path_set = false;
    bool prompt_path_set = false;
    bool prompt_set = false;
    bool stdin_set = false;

    int iarg = 1;
    for (; iarg < argc; ++iarg) {
        std::string arg{argv[iarg]};
        if (arg == "-h" || arg == "--help") {
            print_usage_information(argv[0].c_str());
            return 0;
        }
        else if (arg == "--ids") {
            printing_ids = true;
        }
        else if (arg == "-m" || arg == "--model") {
            if (model_path_set) {
                fprintf(stderr, "Error: -m or --model specified multiple times.\n");
                return 1;
            }
            model_path = argv[++iarg].c_str();
            model_path_set = true;
        }
        else if (arg == "--no-bos") {
            no_bos = true;
        }
        else if (arg == "--no-escape") {
            no_escape = true;
        }
        else if (arg == "--no-parse-special") {
            no_parse_special = true;
        }
        else if (arg == "-p" || arg == "--prompt") {
            if (prompt_set) {
                fprintf(stderr, "Error: -p or --prompt specified multiple times.\n");
                return 1;
            }
            prompt_arg = argv[++iarg].c_str();
            prompt_set = true;
        }
        else if (arg == "-f" || arg == "--file") {
            if (prompt_path_set) {
                fprintf(stderr, "Error: -f or --file specified multiple times.\n");
                return 1;
            }
            prompt_path = argv[++iarg].c_str();
            prompt_path_set = true;
        }
        else if (arg == "--stdin") {
            stdin_set = true;
        }
        else if (arg == "--log-disable") {
            disable_logging = true;
        }
        else if (arg == "--show-count") {
            show_token_count = true;
        }
        else {
            fprintf(stderr, "Error: unknown option '%s'\n", argv[iarg].c_str());
            return 1;
        }
    }

    //////
    // Sanity check the command line arguments.
    //////

    // Check that we have the required stuff set.
    if (model_path_set && model_path == NULL) {
        fprintf(stderr, "Error: --model requires an argument.\n");
        return 1;
    }
    if (!model_path_set) {
        fprintf(stderr, "Error: must specify --model.\n");
        return 1;
    }
    if (prompt_path_set && prompt_path == NULL) {
        fprintf(stderr, "Error: --file requires an argument.\n");
        return 1;
    }
    if (prompt_set && prompt_arg == NULL) {
        fprintf(stderr, "Error: --prompt requires an argument.\n");
        return 1;
    }
    const int prompts_set = !!(prompt_path_set) + !!(prompt_set) + !!(stdin_set);
    if (prompts_set > 1) {
        fprintf(stderr, "Error: --stdin, --file and --prompt are mutually exclusive.\n");
        return 1;
    }
    // Must have some prompt.
    if (prompts_set == 0) {
        fprintf(stderr, "Error: must specify one of: --stdin, --file or --prompt.\n");
        return 1;
    }

    GGML_ASSERT(model_path);
    GGML_ASSERT(prompt_path || prompt_arg || stdin_set);

    //////
    // Figure out where will the prompt come from.
    //////

    std::string prompt;
    if (prompt_path_set) {
        bool success = false;
        prompt = read_prompt_from_file(prompt_path, success);
        if (!success) {
            return 1;
        }
    } else if (prompt_set) {
        prompt = prompt_arg;
    } else {
        GGML_ASSERT(stdin_set);
        // we read stdin *after* loading model (early exit if model cannot
        // be loaded, which can be a nicer user experience)
    }

    //////
    // Start actually doing the tokenizing stuff.
    //////

    if (disable_logging) {
        llama_log_set(llama_log_callback_null, NULL);
    }

    llama_backend_init();

    llama_model_params model_params = llama_model_default_params();
    model_params.vocab_only = true;
    llama_model * model = llama_model_load_from_file(model_path, model_params);
    if (!model) {
        fprintf(stderr, "Error: could not load model from file '%s'.\n", model_path);
        return 1;
    }

    const llama_vocab * vocab = llama_model_get_vocab(model);

    llama_context_params ctx_params = llama_context_default_params();
    llama_context * ctx = llama_init_from_model(model, ctx_params);
    if (!ctx) {
        fprintf(stderr, "Error: could not create context.\n");
        return 1;
    }

    // read entire prompt from stdin?
    if (stdin_set) {
        GGML_ASSERT(!prompt_path_set && !prompt_set);

        std::stringstream stdin_buffer;
        stdin_buffer << std::cin.rdbuf();
        if (std::cin.fail()) {
            fprintf(stderr, "Error: could not read the entire standard input.\n");
            return 1;
        }

        prompt = stdin_buffer.str();
    }

    const bool model_wants_add_bos = llama_vocab_get_add_bos(vocab);
    const bool add_bos = model_wants_add_bos && !no_bos;
    const bool parse_special = !no_parse_special;
    const bool escape = !no_escape;

    if (escape) {
        string_process_escapes(prompt);
    }

    std::vector<llama_token> tokens;
    tokens = common_tokenize(vocab, prompt, add_bos, parse_special);

    if (printing_ids) {
        printf("[");
    }

    for (int i = 0; i < (int) tokens.size(); i++) {
        if (printing_ids) {
            if (i > 0) {
                printf(", ");
            }
            printf("%d", tokens[i]);
        } else {
            bool invalid_utf8 = false;
            printf("%6d -> '", tokens[i]);
            write_utf8_cstr_to_stdout(common_token_to_piece(ctx, tokens[i]).c_str(), invalid_utf8);
            if (invalid_utf8) {
                printf("' (utf-8 decode failure)\n");
            } else {
                printf("'\n");
            }
        }
    }

    if (printing_ids) {
        printf("]\n");
    }

    if (show_token_count) {
        printf("Total number of tokens: %zu\n", tokens.size());
    }
    // silence valgrind
    llama_free(ctx);
    llama_model_free(model);

    return 0;
}